

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsTagGetDescriptions
              (FmsTag tag,FmsIntType *tag_type,void **tags,char ***tag_descr,FmsInt *num_tags)

{
  FmsInt *num_tags_local;
  char ***tag_descr_local;
  void **tags_local;
  FmsIntType *tag_type_local;
  FmsTag tag_local;
  int local_4;
  
  if (tag == (FmsTag)0x0) {
    local_4 = 1;
  }
  else {
    if (tag_type != (FmsIntType *)0x0) {
      *tag_type = tag->tag_type;
    }
    if (tags != (void **)0x0) {
      *tags = tag->described_tags;
    }
    if (tag_descr != (char ***)0x0) {
      *tag_descr = tag->tag_descriptions;
    }
    if (num_tags != (FmsInt *)0x0) {
      *num_tags = tag->num_tag_descriptions;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FmsTagGetDescriptions(FmsTag tag, FmsIntType *tag_type, const void **tags,
                          const char *const **tag_descr, FmsInt *num_tags) {
  if (!tag) { E_RETURN(1); }
  if (tag_type) { *tag_type = tag->tag_type; }
  if (tags) { *tags = tag->described_tags; }
  if (tag_descr) {
    // without the explicit typecast, there is a warning; why?
    *tag_descr = (const char *const *)(tag->tag_descriptions);
  }
  if (num_tags) { *num_tags = tag->num_tag_descriptions; }
  return 0;
}